

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int64_t utext_getPreviousNativeIndex_63(UText *ut)

{
  int iVar1;
  UText *local_38;
  UText *pUStack_28;
  UChar c;
  int64_t result;
  int32_t i;
  UText *ut_local;
  
  iVar1 = ut->chunkOffset + -1;
  if ((iVar1 < 0) || ((ut->chunkContents[iVar1] & 0xfc00U) == 0xdc00)) {
    if ((ut->chunkOffset == 0) && (ut->chunkNativeStart == 0)) {
      ut_local = (UText *)0x0;
    }
    else {
      utext_previous32_63(ut);
      if (ut->nativeIndexingLimit < ut->chunkOffset) {
        local_38 = (UText *)(*ut->pFuncs->mapOffsetToNative)(ut);
      }
      else {
        local_38 = (UText *)(ut->chunkNativeStart + (long)ut->chunkOffset);
      }
      utext_next32_63(ut);
      ut_local = local_38;
    }
  }
  else {
    if (ut->nativeIndexingLimit < iVar1) {
      ut->chunkOffset = iVar1;
      pUStack_28 = (UText *)(*ut->pFuncs->mapOffsetToNative)(ut);
      ut->chunkOffset = ut->chunkOffset + 1;
    }
    else {
      pUStack_28 = (UText *)(ut->chunkNativeStart + (long)iVar1);
    }
    ut_local = pUStack_28;
  }
  return (int64_t)ut_local;
}

Assistant:

U_CAPI int64_t U_EXPORT2
utext_getPreviousNativeIndex(UText *ut) {
    //
    //  Fast-path the common case.
    //     Common means current position is not at the beginning of a chunk
    //     and the preceding character is not supplementary.
    //
    int32_t i = ut->chunkOffset - 1;
    int64_t result;
    if (i >= 0) {
        UChar c = ut->chunkContents[i];
        if (U16_IS_TRAIL(c) == FALSE) {
            if (i <= ut->nativeIndexingLimit) {
                result = ut->chunkNativeStart + i;
            } else {
                ut->chunkOffset = i;
                result = ut->pFuncs->mapOffsetToNative(ut);
                ut->chunkOffset++;
            }
            return result;
        }
    }

    // If at the start of text, simply return 0.
    if (ut->chunkOffset==0 && ut->chunkNativeStart==0) {
        return 0;
    }

    // Harder, less common cases.  We are at a chunk boundary, or on a surrogate.
    //    Keep it simple, use other functions to handle the edges.
    //
    utext_previous32(ut);
    result = UTEXT_GETNATIVEINDEX(ut);
    utext_next32(ut);
    return result;
}